

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyWithDescriptor<true>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,DictionaryPropertyDescriptor<int> **pdescriptor,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  DictionaryPropertyDescriptor<int> *pDVar2;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar4;
  code *pcVar5;
  uint propertyId;
  bool bVar6;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  UndeclaredBlockVariable *pUVar10;
  Var aValue;
  RecyclableObject *function;
  DynamicObject *pDVar11;
  PropertyRecord *pPVar12;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_58;
  int i;
  PropertyRecord *propertyRecord_local;
  DictionaryTypeHandlerBase<int> *local_40;
  PropertyOperationFlags local_38;
  uint local_34;
  
  _i = propertyRecord;
  local_40 = this;
  local_38 = flags;
  if ((pdescriptor == (DictionaryPropertyDescriptor<int> **)0x0) ||
     (*pdescriptor == (DictionaryPropertyDescriptor<int> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e3,"(pdescriptor && *pdescriptor)","pdescriptor && *pdescriptor"
                               );
    if (!bVar6) goto LAB_00db85f9;
    *puVar9 = 0;
  }
  pDVar2 = *pdescriptor;
  local_34 = _i->pid;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e6,"(instance)","instance");
    if (!bVar6) goto LAB_00db85f9;
    *puVar9 = 0;
  }
  if (((pDVar2->Attributes & 8) != 0) && ((pDVar2->flags & IsShadowed) == None)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e7,
                                "((descriptor->Attributes & 0x08) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()))"
                                ,
                                "(descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed())"
                               );
    if (!bVar6) goto LAB_00db85f9;
    *puVar9 = 0;
  }
  if (((local_40->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ea,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar6) goto LAB_00db85f9;
    *puVar9 = 0;
  }
  pRVar3 = (local_40->singletonInstance).ptr;
  if (pRVar3 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    pDVar11 = (DynamicObject *)0x0;
  }
  else {
    pDVar11 = (DynamicObject *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef;
  }
  propertyRecord_local = (PropertyRecord *)value;
  if (pDVar11 != instance && pRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ed,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar6) goto LAB_00db85f9;
    *puVar9 = 0;
  }
  iVar7 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<true>(pDVar2);
  if (iVar7 == -1) {
    iVar7 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar2);
    pPVar12 = propertyRecord_local;
    if (iVar7 != -1) {
      iVar7 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar2);
      aValue = DynamicObject::GetSlot(instance,iVar7);
      function = VarTo<Js::RecyclableObject>(aValue);
      JavascriptOperators::CallSetter(function,instance,pPVar12,(ScriptContext *)0x0);
      bVar6 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(local_40->propertyMap).ptr,(PropertyRecord **)&i,pdescriptor,
                         (int *)&local_58);
      if (bVar6) {
        pDVar2 = *pdescriptor;
        iVar7 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDVar2);
        if (iVar7 == -1) {
          iVar7 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar2);
          if (iVar7 == -1) goto LAB_00db8543;
          DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar2);
        }
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
      }
      else {
        *pdescriptor = (DictionaryPropertyDescriptor<int> *)0x0;
      }
    }
  }
  else {
    if ((-1 < (char)(undefined1)local_38) && (0x3f < pDVar2->Attributes)) {
      scriptContext =
           (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
      pUVar10 = (UndeclaredBlockVariable *)DynamicObject::GetSlot(instance,iVar7);
      if ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
          == pUVar10) {
        JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
      }
    }
    pPVar12 = propertyRecord_local;
    if ((pDVar2->flags & IsInitialized) == None) {
      if ((((local_38 & PropertyOperation_PreInit) == PropertyOperation_None) &&
          (pDVar2->flags = pDVar2->flags | IsInitialized, pDVar11 == instance)) &&
         ((local_38 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None && 0xf < local_34)) {
        if (propertyRecord_local == (PropertyRecord *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x305,"(value != nullptr)","value != nullptr");
          if (!bVar6) goto LAB_00db85f9;
          *puVar9 = 0;
        }
        BVar8 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar8 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x307,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar6) {
LAB_00db85f9:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar9 = 0;
        }
        bVar6 = VarIs<Js::JavascriptFunction>(pPVar12);
        if (bVar6) {
          bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
          bVar6 = !bVar6;
        }
        else {
          bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
          if (bVar6) {
            bVar6 = false;
          }
          else {
            bVar6 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_34,pPVar12);
          }
        }
        pDVar2->flags = bVar6 << 5 | pDVar2->flags & ~IsFixed;
      }
    }
    else {
      InvalidateFixedField<int>(local_40,instance,local_34,pDVar2);
    }
    pPVar12 = propertyRecord_local;
    DynamicTypeHandler::SetSlotUnchecked(instance,iVar7,propertyRecord_local);
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
LAB_00db8543:
  propertyId = local_34;
  bVar6 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(local_34);
  if ((bVar6) &&
     (pTVar1 = &(local_40->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((local_40->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    pJVar4 = (((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
             javascriptLibrary;
    Memory::Recycler::WBSetBit((char *)&local_58);
    pPVar12 = propertyRecord_local;
    local_58 = &pJVar4->typesWithNoSpecialPropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(local_58);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&local_40->super_DynamicTypeHandler,instance,propertyId,pPVar12,SideEffects_Any);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyWithDescriptor(
        _In_ DynamicObject* instance,
        _In_ PropertyRecord const* propertyRecord,
        _Inout_ DictionaryPropertyDescriptor<T> ** pdescriptor,
        _In_ Var value,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyValueInfo* info)
    {
        Assert(pdescriptor && *pdescriptor);
        DictionaryPropertyDescriptor<T> * descriptor = *pdescriptor;
        PropertyId propertyId = propertyRecord->GetPropertyId();
        Assert(instance);
        Assert((descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()));

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
#endif
        T dataSlotAllowLetConstGlobal = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlotAllowLetConstGlobal != NoSlots)
        {
            if (allowLetConstGlobal
                && (descriptor->Attributes & PropertyNoRedecl)
                && !(flags & PropertyOperation_AllowUndecl))
            {
                ScriptContext* scriptContext = instance->GetScriptContext();
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(dataSlotAllowLetConstGlobal)))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }
#if ENABLE_FIXED_FIELDS
            if (!descriptor->GetIsInitialized())
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    descriptor->SetIsInitialized(true);
                    if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif
            SetSlotUnchecked(instance, dataSlotAllowLetConstGlobal, value);
            // If we just added a fixed method, don't populate the inline cache so that we always take the slow path
            // when overwriting this property and correctly invalidate any JIT-ed code that hard-coded this method.
            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, dataSlotAllowLetConstGlobal, GetLetConstGlobalPropertyAttributes<allowLetConstGlobal>(descriptor->Attributes));
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(descriptor->GetSetterPropertyIndex()));
            JavascriptOperators::CallSetter(func, instance, value, NULL);

            // Wait for the setter to return before setting up the inline cache info, as the setter may change
            // the attributes

            if (propertyMap->TryGetReference(propertyRecord, pdescriptor))
            {
                descriptor = *pdescriptor;
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, dataSlot, descriptor->Attributes);
                }
                else if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
                }
            }
            else
            {
                *pdescriptor = nullptr;
            }
        }
        if (NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
        {
            this->SetHasSpecialProperties();
            if (GetFlags() & IsPrototypeFlag)
            {
                instance->GetScriptContext()->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
            }
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
    }